

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O1

int do_late_binding(int argc,char **argv)

{
  size_t sVar1;
  _Bool _Var2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  int iVar10;
  char *p_path;
  long in_FS_OFFSET;
  size_t payload_size;
  char *device_path_found;
  igsc_device_handle handle;
  uint8_t payload [4096];
  undefined4 local_1074;
  long local_1068;
  uint32_t local_1054;
  size_t local_1050;
  char *local_1048;
  undefined8 local_1040;
  uint8_t local_1038 [4096];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (argc < 1) {
    uVar5 = 0xffffffff;
    if (quiet == '\0') {
      do_late_binding_cold_7();
    }
    goto LAB_00109670;
  }
  iVar4 = 0;
  pcVar8 = (char *)0x0;
  p_path = (char *)0x0;
  local_1068 = 0;
  bVar3 = false;
  local_1074 = 0;
  bVar6 = false;
  do {
    pcVar9 = *argv;
    _Var2 = arg_is_device(pcVar9);
    if (_Var2) {
      if (1 < (uint)argc) {
        ppcVar7 = argv + 1;
        iVar10 = argc - 1;
        if (argc == 0) {
          iVar10 = iVar4;
        }
        pcVar8 = argv[1];
        goto LAB_001092d6;
      }
      uVar5 = 0xffffffff;
      if (quiet == '\0') {
        do_late_binding_cold_4();
      }
      goto LAB_00109670;
    }
    _Var2 = arg_is_token(pcVar9,"-p");
    if (_Var2) {
LAB_001092bc:
      if ((uint)argc < 2) {
        uVar5 = 0xffffffff;
        if (quiet == '\0') {
          do_late_binding_cold_3();
        }
        goto LAB_00109670;
      }
      ppcVar7 = argv + 1;
      iVar10 = argc - 1;
      if (argc == 0) {
        iVar10 = iVar4;
      }
      p_path = argv[1];
    }
    else {
      _Var2 = arg_is_token(pcVar9,"--payload");
      if (_Var2) goto LAB_001092bc;
      _Var2 = arg_is_token(pcVar9,"-f");
      if (_Var2) {
LAB_00109322:
        if ((uint)argc < 2) {
          uVar5 = 0xffffffff;
          if (quiet == '\0') {
            do_late_binding_cold_2();
          }
          goto LAB_00109670;
        }
        ppcVar7 = argv + 1;
        iVar10 = argc - 1;
        if (argc == 0) {
          iVar10 = iVar4;
        }
        local_1068 = strtol(argv[1],(char **)0x0,0x10);
        bVar3 = true;
      }
      else {
        _Var2 = arg_is_token(pcVar9,"--flags");
        if (_Var2) goto LAB_00109322;
        _Var2 = arg_is_token(pcVar9,"-t");
        if (!_Var2) {
          _Var2 = arg_is_token(pcVar9,"--type");
          if (_Var2) goto LAB_00109380;
          uVar5 = 0xffffffff;
          if (quiet == '\0') {
            pcVar8 = "Error: Wrong argument %s\n";
LAB_00109647:
            uVar5 = 0xffffffff;
            fprintf(_stderr,pcVar8,pcVar9);
          }
          goto LAB_00109670;
        }
LAB_00109380:
        iVar10 = argc - 1U;
        if (argc == 0U) {
          iVar10 = iVar4;
        }
        if (argc == 0U || argc - 1U == 0) {
          uVar5 = 0xffffffff;
          if (quiet == '\0') {
            do_late_binding_cold_1();
          }
          goto LAB_00109670;
        }
        ppcVar7 = argv + (argc != 0);
        pcVar9 = *ppcVar7;
        _Var2 = arg_is_token(pcVar9,"vr-config");
        bVar6 = true;
        local_1074 = 2;
        if (!_Var2) {
          _Var2 = arg_is_token(pcVar9,"fan-table");
          local_1074 = 1;
          if (!_Var2) {
            uVar5 = 0xffffffff;
            if (quiet == '\0') {
              pcVar8 = "Error: Bad payload type argument %s\n";
              goto LAB_00109647;
            }
            goto LAB_00109670;
          }
        }
      }
    }
LAB_001092d6:
    argv = ppcVar7 + (iVar10 != 0);
    argc = iVar10 - 1U;
    if (iVar10 == 0) {
      argc = 0;
    }
  } while (iVar10 != 0 && iVar10 - 1U != 0);
  if (((p_path == (char *)0x0) || (!bVar3)) || (!bVar6)) {
    uVar5 = 0xffffffff;
    if (quiet == '\0') {
      do_late_binding_cold_6();
    }
    goto LAB_00109670;
  }
  local_1048 = (char *)0x0;
  local_1050 = 0;
  local_1040 = 0;
  if (pcVar8 == (char *)0x0) {
    iVar4 = get_first_device(&local_1048);
    pcVar8 = local_1048;
    if (local_1048 == (char *)0x0 || iVar4 != 0) {
      uVar5 = 1;
      if (quiet == '\0') {
        do_late_binding_cold_5();
      }
      goto LAB_00109670;
    }
  }
  iVar4 = read_from_file_to_buf(p_path,local_1038,0x1000,&local_1050);
  if (iVar4 == 0) {
    uVar5 = igsc_device_init_by_device(&local_1040,pcVar8);
    sVar1 = local_1050;
    if (uVar5 == 0) {
      iVar4 = 3;
      do {
        uVar5 = igsc_device_update_late_binding_config
                          (&local_1040,local_1074,local_1068,local_1038,sVar1,&local_1054);
        if (uVar5 != 0xd) break;
        usleep(2000000);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      if (uVar5 == 0) {
        parse_late_binding_status(local_1054);
        uVar5 = 0;
      }
      else if (quiet == '\0') {
        fprintf(_stderr,"Error: Failed to send late binding command: %d\n",(ulong)uVar5);
      }
    }
    else if (quiet == '\0') {
      pcVar9 = "Error: Cannot initialize device: %s\n";
      goto LAB_00109587;
    }
  }
  else {
    uVar5 = 1;
    if (quiet == '\0') {
      pcVar9 = "Error: Failed to read file : %s\n";
      pcVar8 = p_path;
      uVar5 = 1;
LAB_00109587:
      fprintf(_stderr,pcVar9,pcVar8);
    }
  }
  igsc_device_close(&local_1040);
  free(local_1048);
LAB_00109670:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar5;
  }
  __stack_chk_fail();
}

Assistant:

static int do_late_binding(int argc, char *argv[])
{
    const char *device_path = NULL;
    const char *payload_path = NULL;
    uint32_t flags = 0;
    bool flags_set = false;
    uint32_t type = 0;
    bool type_set = false;

    if (argc <= 0)
    {
        fwupd_error("No arguments provided\n");
        return ERROR_BAD_ARGUMENT;
    }

    do
    {
        if (arg_is_device(argv[0]))
        {
            if (!arg_next(&argc, &argv))
            {
                fwupd_error("No device to send the command to\n");
                return ERROR_BAD_ARGUMENT;
            }
            device_path = argv[0];
        }
        else if (arg_is_payload(argv[0]))
        {
            if (!arg_next(&argc, &argv))
            {
                fwupd_error("No payload file to send\n");
                return ERROR_BAD_ARGUMENT;
            }
            payload_path = argv[0];
        }
        else if (arg_is_flags(argv[0]))
        {
            if (!arg_next(&argc, &argv))
            {
                fwupd_error("No flags argument provided\n");
                return ERROR_BAD_ARGUMENT;
            }
            flags = (uint32_t)strtol(argv[0], NULL, 16);
            flags_set = true;
        }
        else if (arg_is_type(argv[0]))
        {
            if (!arg_next(&argc, &argv))
            {
                fwupd_error("No payload type argument provided\n");
                return ERROR_BAD_ARGUMENT;
            }
            if (arg_is_vr_config(argv[0]))
            {
                type = CSC_LATE_BINDING_TYPE_VR_CONFIG;
            }
            else if (arg_is_fan_table(argv[0]))
            {
                type = CSC_LATE_BINDING_TYPE_FAN_TABLE;
            }
            else
            {
                fwupd_error("Bad payload type argument %s\n", argv[0]);
                return ERROR_BAD_ARGUMENT;
            }
            type_set = true;
        }
        else
        {
            fwupd_error("Wrong argument %s\n", argv[0]);
            return ERROR_BAD_ARGUMENT;
        }
    } while(arg_next(&argc, &argv));

    if (payload_path && flags_set && type_set)
    {
        return late_binding(device_path, payload_path, type, flags);
    }

    fwupd_error("No payload file or payload type or flags provided\n");
    return ERROR_BAD_ARGUMENT;
}